

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O3

int32_t icu_63::number::impl::SimpleModifier::formatTwoArgPattern
                  (SimpleFormatter *compiled,NumberStringBuilder *result,int32_t index,
                  int32_t *outPrefixLength,int32_t *outSuffixLength,Field field,UErrorCode *status)

{
  UnicodeString *unistr;
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char16_t *pcVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  
  uVar1 = (compiled->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  uVar3 = (uint)uVar1;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar8 = (compiled->compiledPattern).fUnion.fFields.fArray;
    }
    else {
      pcVar8 = (compiled->compiledPattern).fUnion.fStackFields.fBuffer;
    }
  }
  else {
    pcVar8 = (char16_t *)0x0;
  }
  uVar10 = (int)(short)uVar1 >> 5;
  uVar4 = (compiled->compiledPattern).fUnion.fFields.fLength;
  uVar9 = uVar10;
  if ((short)uVar1 < 0) {
    uVar9 = uVar4;
  }
  if ((uVar9 == 0) || (*pcVar8 != L'\x02')) {
    *status = U_INTERNAL_PROGRAM_ERROR;
    return 0;
  }
  unistr = &compiled->compiledPattern;
  uVar5 = 0xffff;
  if (uVar9 == 1) {
LAB_0025bada:
    iVar2 = uVar5 - 0x100;
    NumberStringBuilder::insert(result,index,unistr,2,uVar5 - 0xfe,field,status);
    uVar5 = uVar5 - 0xfd;
    uVar3 = (uint)(compiled->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
    uVar4 = (compiled->compiledPattern).fUnion.fFields.fLength;
    uVar10 = (int)uVar3 >> 5;
  }
  else {
    if ((uVar1 & 2) == 0) {
      pcVar8 = (compiled->compiledPattern).fUnion.fFields.fArray;
    }
    else {
      pcVar8 = (char16_t *)((long)&(compiled->compiledPattern).fUnion + 2);
    }
    uVar5 = (uint)(ushort)pcVar8[1];
    if (0xff < (ushort)pcVar8[1]) goto LAB_0025bada;
    iVar2 = 0;
    uVar5 = 2;
  }
  uVar9 = uVar10;
  if ((short)uVar3 < 0) {
    uVar9 = uVar4;
  }
  if (uVar5 < uVar9) {
    if ((uVar3 & 2) == 0) {
      pcVar8 = (compiled->compiledPattern).fUnion.fFields.fArray;
    }
    else {
      pcVar8 = (char16_t *)((long)&(compiled->compiledPattern).fUnion + 2);
    }
    uVar9 = (uint)(ushort)pcVar8[uVar5];
    uVar6 = uVar5 + 1;
    iVar11 = iVar2;
    if ((ushort)pcVar8[uVar5] < 0x100) goto LAB_0025bbb5;
  }
  else {
    uVar9 = 0xffff;
  }
  iVar7 = uVar5 + 1;
  NumberStringBuilder::insert(result,iVar2 + index,unistr,iVar7,iVar7 + uVar9 + -0x100,field,status)
  ;
  iVar11 = iVar2 + uVar9 + -0x100;
  uVar6 = (uVar9 - 0xff) + iVar7;
  uVar3 = (uint)(compiled->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  uVar4 = (compiled->compiledPattern).fUnion.fFields.fLength;
  uVar10 = (int)uVar3 >> 5;
LAB_0025bbb5:
  if ((short)uVar3 < 0) {
    uVar10 = uVar4;
  }
  iVar7 = 0;
  if (uVar6 != uVar10) {
    iVar7 = 0xfeff;
    if (uVar6 < uVar10) {
      if ((uVar3 & 2) == 0) {
        pcVar8 = (compiled->compiledPattern).fUnion.fFields.fArray;
      }
      else {
        pcVar8 = (char16_t *)((long)&(compiled->compiledPattern).fUnion + 2);
      }
      iVar7 = (ushort)pcVar8[uVar6] - 0x100;
    }
    NumberStringBuilder::insert
              (result,index + iVar11,unistr,uVar6 + 1,uVar6 + iVar7 + 1,field,status);
    iVar11 = iVar11 + iVar7;
  }
  *outPrefixLength = iVar2;
  *outSuffixLength = iVar7;
  return iVar11;
}

Assistant:

int32_t
SimpleModifier::formatTwoArgPattern(const SimpleFormatter& compiled, NumberStringBuilder& result,
                                    int32_t index, int32_t* outPrefixLength, int32_t* outSuffixLength,
                                    Field field, UErrorCode& status) {
    const UnicodeString& compiledPattern = compiled.compiledPattern;
    int32_t argLimit = SimpleFormatter::getArgumentLimit(
            compiledPattern.getBuffer(), compiledPattern.length());
    if (argLimit != 2) {
        status = U_INTERNAL_PROGRAM_ERROR;
        return 0;
    }
    int32_t offset = 1; // offset into compiledPattern
    int32_t length = 0; // chars added to result

    int32_t prefixLength = compiledPattern.charAt(offset);
    offset++;
    if (prefixLength < ARG_NUM_LIMIT) {
        // No prefix
        prefixLength = 0;
    } else {
        prefixLength -= ARG_NUM_LIMIT;
        result.insert(index + length, compiledPattern, offset, offset + prefixLength, field, status);
        offset += prefixLength;
        length += prefixLength;
        offset++;
    }

    int32_t infixLength = compiledPattern.charAt(offset);
    offset++;
    if (infixLength < ARG_NUM_LIMIT) {
        // No infix
        infixLength = 0;
    } else {
        infixLength -= ARG_NUM_LIMIT;
        result.insert(index + length, compiledPattern, offset, offset + infixLength, field, status);
        offset += infixLength;
        length += infixLength;
        offset++;
    }

    int32_t suffixLength;
    if (offset == compiledPattern.length()) {
        // No suffix
        suffixLength = 0;
    } else {
        suffixLength = compiledPattern.charAt(offset) -  ARG_NUM_LIMIT;
        offset++;
        result.insert(index + length, compiledPattern, offset, offset + suffixLength, field, status);
        length += suffixLength;
    }

    *outPrefixLength = prefixLength;
    *outSuffixLength = suffixLength;

    return length;
}